

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_3d.hpp
# Opt level: O0

cartesian_cubic<float> *
sisl::io::read_raw_file<float>
          (int *rx,int *ry,int *rz,string *file,e_datatype *type,bool *swap_endian)

{
  undefined4 uVar1;
  double dVar2;
  ushort uVar3;
  byte bVar4;
  _Ios_Openmode _Var5;
  int iVar6;
  char *pcVar7;
  ulong uVar8;
  void *pvVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined8 *puVar10;
  undefined1 auVar11 [16];
  uint local_370;
  uint local_360;
  int local_2fc;
  int local_2f8;
  int k_4;
  int j_4;
  int i_4;
  double *l_buff_4;
  int local_2e0;
  int k_3;
  int j_3;
  int i_3;
  float *l_buff_3;
  uint32_t data_1;
  int k_2;
  int j_2;
  int i_2;
  uint *l_buff_2;
  uint uStack_2b0;
  uint16_t data;
  int k_1;
  int j_1;
  int i_1;
  unsigned_short *l_buff_1;
  int local_298;
  int k;
  int j;
  int i;
  uchar *l_buff;
  cartesian_cubic<float> *lattice;
  char *buffer;
  undefined1 auStack_258 [8];
  streampos size;
  ifstream fp;
  bool *swap_endian_local;
  e_datatype *type_local;
  string *file_local;
  int *rz_local;
  int *ry_local;
  int *rx_local;
  
  pcVar7 = (char *)std::__cxx11::string::c_str();
  _Var5 = std::operator|(_S_in,_S_bin);
  _Var5 = std::operator|(_Var5,_S_ate);
  std::ifstream::ifstream(&size._M_state,pcVar7,_Var5);
  std::fpos<__mbstate_t>::fpos((fpos<__mbstate_t> *)auStack_258);
  bVar4 = std::ios::good();
  if (((bVar4 & 1) == 0) || (bVar4 = std::ifstream::is_open(), (bVar4 & 1) == 0)) {
    rx_local = (int *)0x0;
  }
  else {
    auVar11 = std::istream::tellg();
    size._M_off = auVar11._8_8_;
    auStack_258 = auVar11._0_8_;
    std::istream::seekg((long)&size._M_state,_S_beg);
    uVar8 = std::fpos::operator_cast_to_long((fpos *)auStack_258);
    if ((long)uVar8 < 0) {
      uVar8 = 0xffffffffffffffff;
    }
    pvVar9 = operator_new__(uVar8);
    std::fpos::operator_cast_to_long((fpos *)auStack_258);
    std::istream::read((char *)&size._M_state,(long)pvVar9);
    rx_local = (int *)operator_new(0x68);
    cartesian_cubic<float>::cartesian_cubic
              ((cartesian_cubic<float> *)rx_local,*rx - 1,*ry - 1,*rz - 1);
    switch(*type) {
    case SDT_UINT8:
      for (k = 0; k < *rx; k = k + 1) {
        for (local_298 = 0; local_298 < *ry; local_298 = local_298 + 1) {
          for (l_buff_1._4_4_ = 0; l_buff_1._4_4_ < *rz; l_buff_1._4_4_ = l_buff_1._4_4_ + 1) {
            bVar4 = *(byte *)((long)pvVar9 + (long)(k + *rx * (local_298 + *ry * l_buff_1._4_4_)));
            iVar6 = (**(((cartesian_cubic<float> *)rx_local)->super_base_lattice<float>).
                       _vptr_base_lattice)();
            *(float *)CONCAT44(extraout_var,iVar6) = (float)bVar4;
          }
        }
      }
      break;
    case SDT_UINT16:
      for (k_1 = 0; k_1 < *rx; k_1 = k_1 + 1) {
        for (uStack_2b0 = 0; (int)uStack_2b0 < *ry; uStack_2b0 = uStack_2b0 + 1) {
          for (l_buff_2._4_4_ = 0; (int)l_buff_2._4_4_ < *rz; l_buff_2._4_4_ = l_buff_2._4_4_ + 1) {
            uVar3 = *(ushort *)
                     ((long)pvVar9 +
                     (long)(int)(k_1 + *rx * (uStack_2b0 + *ry * l_buff_2._4_4_)) * 2);
            if ((*swap_endian & 1U) == 0) {
              local_360 = (uint)uVar3;
            }
            else {
              local_360 = (int)(uVar3 & 0xff00) >> 8 | (uVar3 & 0xff) << 8;
            }
            iVar6 = (**(((cartesian_cubic<float> *)rx_local)->super_base_lattice<float>).
                       _vptr_base_lattice)
                              (rx_local,(ulong)(uint)k_1,(ulong)uStack_2b0,(ulong)l_buff_2._4_4_);
            *(float *)CONCAT44(extraout_var_00,iVar6) = (float)local_360;
          }
        }
      }
      break;
    case SDT_UINT32:
      for (k_2 = 0; k_2 < *rx; k_2 = k_2 + 1) {
        for (data_1 = 0; (int)data_1 < *ry; data_1 = data_1 + 1) {
          for (l_buff_3._4_4_ = 0; (int)l_buff_3._4_4_ < *rz; l_buff_3._4_4_ = l_buff_3._4_4_ + 1) {
            local_370 = *(uint *)((long)pvVar9 +
                                 (long)(int)(k_2 + *rx * (data_1 + *ry * l_buff_3._4_4_)) * 4);
            if ((*swap_endian & 1U) != 0) {
              local_370 = local_370 >> 0x18 | (local_370 & 0xff00) << 8 | local_370 >> 8 & 0xff00 |
                          local_370 << 0x18;
            }
            iVar6 = (**(((cartesian_cubic<float> *)rx_local)->super_base_lattice<float>).
                       _vptr_base_lattice)
                              (rx_local,(ulong)(uint)k_2,(ulong)data_1,(ulong)l_buff_3._4_4_);
            *(float *)CONCAT44(extraout_var_01,iVar6) = (float)local_370;
          }
        }
      }
      break;
    case SDT_FLOAT:
      for (k_3 = 0; k_3 < *rx; k_3 = k_3 + 1) {
        for (local_2e0 = 0; local_2e0 < *ry; local_2e0 = local_2e0 + 1) {
          for (l_buff_4._4_4_ = 0; l_buff_4._4_4_ < *rz; l_buff_4._4_4_ = l_buff_4._4_4_ + 1) {
            uVar1 = *(undefined4 *)
                     ((long)pvVar9 + (long)(k_3 + *rx * (local_2e0 + *ry * l_buff_4._4_4_)) * 4);
            iVar6 = (**(((cartesian_cubic<float> *)rx_local)->super_base_lattice<float>).
                       _vptr_base_lattice)();
            *(undefined4 *)CONCAT44(extraout_var_02,iVar6) = uVar1;
          }
        }
      }
      break;
    case SDT_DOUBLE:
      for (k_4 = 0; k_4 < *rx; k_4 = k_4 + 1) {
        for (local_2f8 = 0; local_2f8 < *ry; local_2f8 = local_2f8 + 1) {
          for (local_2fc = 0; local_2fc < *rz; local_2fc = local_2fc + 1) {
            dVar2 = *(double *)
                     ((long)pvVar9 + (long)(k_4 + *rx * (local_2f8 + *ry * local_2fc)) * 8);
            iVar6 = (**(((cartesian_cubic<float> *)rx_local)->super_base_lattice<float>).
                       _vptr_base_lattice)();
            *(float *)CONCAT44(extraout_var_03,iVar6) = (float)dVar2;
          }
        }
      }
      break;
    default:
      puVar10 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar10 = "Unknown datatype passed to sisl::io::read_raw_file()!";
      __cxa_throw(puVar10,&char_const*::typeinfo,0);
    }
    if (pvVar9 != (void *)0x0) {
      operator_delete__(pvVar9);
    }
  }
  std::ifstream::~ifstream(&size._M_state);
  return (cartesian_cubic<float> *)rx_local;
}

Assistant:

inline cartesian_cubic<O>
       *read_raw_file(const int &rx, const int &ry, const int &rz,
                      const std::string &file, 
                      const e_datatype &type,
                      const bool &swap_endian = false) {
    using namespace std;

    // Define this to help indexing the raw data
    #define INDEX(i,j,k)  i + rx * ( j + ry*k )

    // Open the file
    ifstream fp(file.c_str(), ios::in | ios::binary | ios::ate);
    streampos size;

    if (!fp.good() || !fp.is_open()) return nullptr;
    size = fp.tellg();
    fp.seekg(0, ios::beg);

    // Allocate and Read
    char *buffer = new char[size];
    fp.read(buffer, size);

    // Allocate the array
    cartesian_cubic<O> *lattice = new cartesian_cubic<O>(rx-1, ry-1, rz-1);

    switch (type) {
        case SDT_UINT8:
        {
            unsigned char *l_buff = (unsigned char *)buffer;
            #pragma omp parallel for
            for(int i = 0; i < rx; i++)
                for(int j = 0; j < ry; j++)
                    for(int k = 0; k < rz; k++)
                        (*lattice)(i,j,k) = (O)l_buff[INDEX(i,j,k)];
            break;
        }
        case SDT_UINT16:
        {
            unsigned short *l_buff = (unsigned short *)buffer;
            #pragma omp parallel for
            for(int i = 0; i < rx; i++)
                for(int j = 0; j < ry; j++)
                    for(int k = 0; k < rz; k++) {
                        uint16_t data = l_buff[INDEX(i,j,k)];

                        (*lattice)(i,j,k) = (O)(swap_endian ? SWAP_16(data) : data); 
                    }
            break;
        }
        case SDT_UINT32:
        {
            unsigned int *l_buff = (unsigned int *)buffer;
            #pragma omp parallel for
            for(int i = 0; i < rx; i++)
                for(int j = 0; j < ry; j++)
                    for(int k = 0; k < rz; k++) {
                        uint32_t data = l_buff[INDEX(i,j,k)];
                        (*lattice)(i,j,k) = (O)(swap_endian ? SWAP_32(data) : data); 
                    }
            break;
        }
        case SDT_FLOAT:
        {
            float *l_buff = (float *)buffer;
            #pragma omp parallel for
            for(int i = 0; i < rx; i++)
                for(int j = 0; j < ry; j++)
                    for(int k = 0; k < rz; k++)
                        (*lattice)(i,j,k) = (O)l_buff[INDEX(i,j,k)];
            break;
        }
        case SDT_DOUBLE:
        {
            double *l_buff = (double *)buffer;
            #pragma omp parallel for
            for(int i = 0; i < rx; i++)
                for(int j = 0; j < ry; j++)
                    for(int k = 0; k < rz; k++)
                        (*lattice)(i,j,k) = (O)l_buff[INDEX(i,j,k)];
            break;
        }
        default:
            throw "Unknown datatype passed to sisl::io::read_raw_file()!";
    }
    delete[] buffer;
    #undef INDEX

    return lattice;
}